

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::addMsgField(DataDictionary *this,string *msgType,int field)

{
  mapped_type *this_00;
  mapped_type *this_01;
  int local_1c;
  string *psStack_18;
  int field_local;
  string *msgType_local;
  DataDictionary *this_local;
  
  local_1c = field;
  psStack_18 = msgType;
  msgType_local = (string *)this;
  if ((this->m_storeMsgFieldsOrder & 1U) != 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>_>
              ::operator[](&this->m_messageOrderedFields,msgType);
    MessageFieldsOrderHolder::push_back(this_00,local_1c);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_messageFields,psStack_18);
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_01,&local_1c);
  return;
}

Assistant:

void addMsgField(const std::string &msgType, int field) {
    if (m_storeMsgFieldsOrder) {
      m_messageOrderedFields[msgType].push_back(field);
    }

    m_messageFields[msgType].insert(field);
  }